

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void fe::operations::applyOperationT<fe::operations::op_blit_colored,fe::PixelA8,fe::PixelA8>
               (op_blit_colored *op,PixelA8 *srcPixelFormat,PixelA8 *destPixelFormat,ImageData *src,
               ImageData *dest)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  int y;
  int iVar6;
  int iVar7;
  uchar *srcLine;
  byte *pbVar8;
  uchar *destLine;
  uint8_t *puVar9;
  
  bVar3 = check(src,dest);
  if (bVar3) {
    pbVar4 = (src->super_fe_image).data;
    puVar5 = (dest->super_fe_image).data;
    iVar1 = (dest->super_fe_image).w;
    iVar2 = (dest->super_fe_image).h;
    for (iVar6 = 0; pbVar8 = pbVar4, puVar9 = puVar5, iVar7 = iVar1, iVar6 != iVar2;
        iVar6 = iVar6 + 1) {
      while (iVar7 != 0) {
        *puVar9 = (uint8_t)(((uint)(op->color).field_0.field_0.bytes[3] * (uint)*pbVar8) / 0xff);
        pbVar8 = pbVar8 + (src->super_fe_image).bytespp;
        puVar9 = puVar9 + (dest->super_fe_image).bytespp;
        iVar7 = iVar7 + -1;
      }
      pbVar4 = pbVar4 + (src->super_fe_image).pitch;
      puVar5 = puVar5 + (dest->super_fe_image).pitch;
    }
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }